

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O2

void tchecker::clockbounds::compute_clockbounds(system_t *system,clockbounds_t *clockbounds)

{
  local_lu_map_t *plVar1;
  bool bVar2;
  df_solver_t *this;
  const_iterator __r;
  typed_expression_t *ptVar3;
  const_iterator __r_00;
  typed_statement_t *stmt;
  runtime_error *this_00;
  range_t<tchecker::system::locs_t::const_iterator_t,_tchecker::system::locs_t::const_iterator_t>
  rVar4;
  range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>
  rVar5;
  local_lu_map_t *local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  local_lu_map_t *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  shared_ptr<tchecker::clockbounds::df_solver_t> solver;
  
  this = (df_solver_t *)operator_new(0x40);
  df_solver_t::df_solver_t(this,system);
  std::__shared_ptr<tchecker::clockbounds::df_solver_t,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<tchecker::clockbounds::df_solver_t,void>
            ((__shared_ptr<tchecker::clockbounds::df_solver_t,(__gnu_cxx::_Lock_policy)2> *)&solver,
             this);
  rVar4 = tchecker::system::locs_t::locations(&(system->super_system_t).super_system_t.super_locs_t)
  ;
  for (__r._M_current =
            (shared_ptr<tchecker::system::loc_t> *)rVar4._begin.super_const_iterator._M_current;
      (const_iterator)__r._M_current !=
      rVar4._end.super_const_iterator._M_current.super_const_iterator;
      __r._M_current = __r._M_current + 1) {
    std::__shared_ptr<tchecker::system::loc_t_const,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<tchecker::system::loc_t,void>
              ((__shared_ptr<tchecker::system::loc_t_const,(__gnu_cxx::_Lock_policy)2> *)&local_68,
               &(__r._M_current)->
                super___shared_ptr<tchecker::system::loc_t,_(__gnu_cxx::_Lock_policy)2>);
    ptVar3 = ta::system_t::invariant(system,local_68->_clock_nb);
    add_location_constraints(ptVar3,local_68->_clock_nb,&solver);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60);
  }
  rVar5 = tchecker::system::edges_t::edges(&(system->super_system_t).super_system_t.super_edges_t);
  for (__r_00._M_current =
            (shared_ptr<tchecker::system::edge_t> *)rVar5._begin.super_const_iterator._M_current;
      (const_iterator)__r_00._M_current !=
      rVar5._end.super_const_iterator._M_current.super_const_iterator;
      __r_00._M_current = __r_00._M_current + 1) {
    std::__shared_ptr<tchecker::system::edge_t_const,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<tchecker::system::edge_t,void>
              ((__shared_ptr<tchecker::system::edge_t_const,(__gnu_cxx::_Lock_policy)2> *)&local_68,
               &(__r_00._M_current)->
                super___shared_ptr<tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>);
    ptVar3 = ta::system_t::guard(system,local_68->_clock_nb);
    stmt = ta::system_t::statement(system,local_68->_clock_nb);
    add_edge_constraints
              (ptVar3,stmt,
               *(loc_id_t *)
                &(local_68->_L).
                 super__Vector_base<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*,_std::allocator<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*>_>
                 ._M_impl.super__Vector_impl_data._M_start,
               *(loc_id_t *)
                ((long)&(local_68->_L).
                        super__Vector_base<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*,_std::allocator<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*>_>
                        ._M_impl.super__Vector_impl_data._M_start + 4),&solver);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60);
  }
  clockbounds_t::local_lu_map((clockbounds_t *)&local_68);
  bVar2 = df_solver_t::solve(solver.
                             super___shared_ptr<tchecker::clockbounds::df_solver_t,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr,local_68);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60);
  if (bVar2) {
    clockbounds_t::global_lu_map((clockbounds_t *)&local_68);
    plVar1 = local_68;
    clockbounds_t::local_lu_map((clockbounds_t *)&local_58);
    fill_global_lu_map((global_lu_map_t *)plVar1,local_58);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60);
    clockbounds_t::local_m_map((clockbounds_t *)&local_68);
    plVar1 = local_68;
    clockbounds_t::local_lu_map((clockbounds_t *)&local_58);
    fill_local_m_map((local_m_map_t *)plVar1,local_58);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60);
    clockbounds_t::global_m_map((clockbounds_t *)&local_68);
    clockbounds_t::local_lu_map((clockbounds_t *)&local_58);
    fill_global_m_map((global_m_map_t *)local_68,local_58);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&solver.
                super___shared_ptr<tchecker::clockbounds::df_solver_t,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"compute_clockbounds: clock bounds cannot be computed");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void compute_clockbounds(tchecker::ta::system_t const & system, tchecker::clockbounds::clockbounds_t & clockbounds)
{
  std::shared_ptr<tchecker::clockbounds::df_solver_t> solver{new tchecker::clockbounds::df_solver_t{system}};

  for (tchecker::system::loc_const_shared_ptr_t const & loc : system.locations())
    tchecker::clockbounds::add_location_constraints(system.invariant(loc->id()), loc->id(), solver);

  for (tchecker::system::edge_const_shared_ptr_t const & edge : system.edges())
    tchecker::clockbounds::add_edge_constraints(system.guard(edge->id()), system.statement(edge->id()), edge->src(),
                                                edge->tgt(), solver);

  bool const has_solution = solver->solve(*clockbounds.local_lu_map());
  if (!has_solution)
    throw std::runtime_error("compute_clockbounds: clock bounds cannot be computed");

  tchecker::clockbounds::fill_global_lu_map(*clockbounds.global_lu_map(), *clockbounds.local_lu_map());
  tchecker::clockbounds::fill_local_m_map(*clockbounds.local_m_map(), *clockbounds.local_lu_map());
  tchecker::clockbounds::fill_global_m_map(*clockbounds.global_m_map(), *clockbounds.local_lu_map());
}